

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void par_shapes__cross3(float *result,float *a,float *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float z;
  float y;
  float x;
  float *b_local;
  float *a_local;
  float *result_local;
  
  fVar1 = a[2];
  fVar2 = *b;
  fVar3 = *a;
  fVar4 = b[2];
  fVar5 = *a;
  fVar6 = b[1];
  fVar7 = a[1];
  fVar8 = *b;
  *result = a[1] * b[2] + -(a[2] * b[1]);
  result[1] = fVar1 * fVar2 + -(fVar3 * fVar4);
  result[2] = fVar5 * fVar6 + -(fVar7 * fVar8);
  return;
}

Assistant:

static void par_shapes__cross3(float* result, float const* a, float const* b)
{
    float x = (a[1] * b[2]) - (a[2] * b[1]);
    float y = (a[2] * b[0]) - (a[0] * b[2]);
    float z = (a[0] * b[1]) - (a[1] * b[0]);
    result[0] = x;
    result[1] = y;
    result[2] = z;
}